

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

OpacityNode * rengine::OpacityNode::create(void)

{
  undefined1 *puVar1;
  OpacityNode *this;
  
  if (__allocation_pool_rengine_OpacityNode.m_nextFree <
      __allocation_pool_rengine_OpacityNode.m_poolSize) {
    this = AllocationPool<rengine::OpacityNode>::allocate(&__allocation_pool_rengine_OpacityNode);
    puVar1 = &(this->super_Node).field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    this = (OpacityNode *)operator_new(0x38);
    OpacityNode(this);
  }
  return this;
}

Assistant:

static OpacityNode *create(float opacity) {
        auto node = create();
        node->setOpacity(opacity);
        return node;
    }